

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_parse_uri(char *p,char **prot,char **ads,int *port,char **path)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  
  *prot = p;
  pcVar4 = p;
  do {
    if (*pcVar4 == ':') {
      if ((pcVar4[1] == '/') && (pcVar4[2] == '/')) {
        *pcVar4 = '\0';
        p = pcVar4 + 3;
        goto LAB_001284b5;
      }
    }
    else if (*pcVar4 == '\0') break;
    pcVar4 = pcVar4 + 1;
  } while( true );
  *prot = pcVar4;
LAB_001284b5:
  cVar1 = *p;
  *ads = p;
  pcVar4 = *prot;
  iVar3 = strcmp(pcVar4,"http");
  iVar5 = 0x50;
  if ((iVar3 != 0) && (((*pcVar4 != 'w' || (pcVar4[1] != 's')) || (pcVar4[2] != '\0')))) {
    iVar3 = strcmp(pcVar4,"https");
    iVar5 = 0x1bb;
    if ((iVar3 != 0) && (iVar3 = strcmp(pcVar4,"wss"), iVar3 != 0)) goto LAB_0012851a;
  }
  *port = iVar5;
LAB_0012851a:
  cVar2 = *p;
  if (cVar2 == '[') {
    *ads = p + 1;
    for (; *p != '\0'; p = p + 1) {
      if (*p == ']') {
        *p = '\0';
        cVar2 = p[1];
        p = p + 1;
        goto LAB_0012856b;
      }
    }
  }
  else {
    while ((cVar2 != '\0' && (cVar2 != ':'))) {
      if (cVar1 != '+' && cVar2 == '/') goto LAB_0012859b;
      pcVar4 = p + 1;
      p = p + 1;
      cVar2 = *pcVar4;
    }
LAB_0012856b:
    if (cVar2 == ':') {
      *p = '\0';
      p = p + 1;
      iVar3 = atoi(p);
      *port = iVar3;
      for (; (*p != '\0' && (*p != '/')); p = p + 1) {
      }
    }
  }
LAB_0012859b:
  *path = "/";
  if ((*p != '\0') && (*p = '\0', p[1] != '\0')) {
    *path = p + 1;
  }
  return 0;
}

Assistant:

int
lws_parse_uri(char *p, const char **prot, const char **ads, int *port,
	      const char **path)
{
	const char *end;
	char unix_skt = 0;

	/* cut up the location into address, port and path */
	*prot = p;
	while (*p && (*p != ':' || p[1] != '/' || p[2] != '/'))
		p++;
	if (!*p) {
		end = p;
		p = (char *)*prot;
		*prot = end;
	} else {
		*p = '\0';
		p += 3;
	}
	if (*p == '+') /* unix skt */
		unix_skt = 1;

	*ads = p;
	if (!strcmp(*prot, "http") || !strcmp(*prot, "ws"))
		*port = 80;
	else if (!strcmp(*prot, "https") || !strcmp(*prot, "wss"))
		*port = 443;

	if (*p == '[') {
		++(*ads);
		while (*p && *p != ']')
			p++;
		if (*p)
			*p++ = '\0';
	} else
		while (*p && *p != ':' && (unix_skt || *p != '/'))
			p++;

	if (*p == ':') {
		*p++ = '\0';
		*port = atoi(p);
		while (*p && *p != '/')
			p++;
	}
	*path = "/";
	if (*p) {
		*p++ = '\0';
		if (*p)
			*path = p;
	}

	return 0;
}